

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrLib.c
# Opt level: O0

void Rwr_ManPrecompute(Rwr_Man_t *p)

{
  int iVar1;
  int iVar2;
  int Volume_00;
  Rwr_Node_t *pRVar3;
  Rwr_Node_t *p1_00;
  Rwr_Node_t *pRVar4;
  Rwr_Node_t *p1_01;
  int *piVar5;
  uint local_38;
  uint local_34;
  int nNodes;
  int LevelOld;
  int Volume;
  int Level;
  int k;
  int i;
  Rwr_Node_t *p1;
  Rwr_Node_t *p0;
  Rwr_Man_t *p_local;
  
  local_34 = 0xffffffff;
  Level = 1;
  do {
    iVar1 = Vec_PtrSize(p->vForest);
    if (iVar1 <= Level) {
LAB_0055c095:
      Rwr_ManIncTravId(p);
      local_38 = 0;
      for (Level = 5; iVar1 = Vec_PtrSize(p->vForest), Level < iVar1; Level = Level + 1) {
        pRVar3 = (Rwr_Node_t *)Vec_PtrEntry(p->vForest,Level);
        if ((*(uint *)&pRVar3->field_0xe & 0xffff) ==
            (uint)p->puCanons[*(uint *)&pRVar3->field_0xe & 0xffff]) {
          Rwr_MarkUsed_rec(p,pRVar3);
          local_38 = local_38 + 1;
        }
      }
      Volume = 5;
      for (Level = 5; iVar1 = Vec_PtrSize(p->vForest), Level < iVar1; Level = Level + 1) {
        piVar5 = (int *)Vec_PtrEntry(p->vForest,Level);
        if ((*(uint *)((long)piVar5 + 0xe) >> 0x1e & 1) != 0) {
          p->vForest->pArray[Volume] = piVar5;
          *piVar5 = Volume;
          Volume = Volume + 1;
        }
      }
      p->vForest->nSize = Volume;
      printf("Total canonical = %4d. Total used = %5d.\n",(ulong)local_38,
             (ulong)(uint)p->vForest->nSize);
      return;
    }
    pRVar3 = (Rwr_Node_t *)Vec_PtrEntry(p->vForest,Level);
    for (Volume = 1; iVar1 = Vec_PtrSize(p->vForest), Volume < iVar1; Volume = Volume + 1) {
      p1_00 = (Rwr_Node_t *)Vec_PtrEntry(p->vForest,Volume);
      if ((int)local_34 < (int)(*(uint *)&pRVar3->field_0xe >> 0x18 & 0x3f)) {
        local_34 = *(uint *)&pRVar3->field_0xe >> 0x18 & 0x3f;
        printf("Starting level %d  (at %d nodes).\n",(ulong)(local_34 + 1),(ulong)(uint)Level);
        printf("Considered = %5d M.   Found = %8d.   Classes = %6d.   Trying %7d.\n",
               (long)p->nConsidered / 1000000 & 0xffffffff,(ulong)(uint)p->vForest->nSize,
               (ulong)(uint)p->nClasses,(ulong)(uint)Level);
      }
      if ((Volume == Level) ||
         (5 < (*(uint *)&pRVar3->field_0xe >> 0x18 & 0x3f) +
              (*(uint *)&p1_00->field_0xe >> 0x18 & 0x3f))) break;
      iVar1 = Abc_MaxInt(*(uint *)&pRVar3->field_0xe >> 0x18 & 0x3f,
                         *(uint *)&p1_00->field_0xe >> 0x18 & 0x3f);
      iVar1 = iVar1 + 1;
      iVar2 = Rwr_ManNodeVolume(p,pRVar3,p1_00);
      Volume_00 = iVar2 + 1;
      Rwr_ManTryNode(p,pRVar3,p1_00,0,iVar1,Volume_00);
      pRVar4 = Rwr_Not(pRVar3);
      Rwr_ManTryNode(p,pRVar4,p1_00,0,iVar1,Volume_00);
      pRVar4 = Rwr_Not(p1_00);
      Rwr_ManTryNode(p,pRVar3,pRVar4,0,iVar1,Volume_00);
      pRVar4 = Rwr_Not(pRVar3);
      p1_01 = Rwr_Not(p1_00);
      Rwr_ManTryNode(p,pRVar4,p1_01,0,iVar1,Volume_00);
      Rwr_ManTryNode(p,pRVar3,p1_00,1,iVar1,iVar2 + 2);
      if (p->nConsidered % 50000000 == 0) {
        printf("Considered = %5d M.   Found = %8d.   Classes = %6d.   Trying %7d.\n",
               (long)p->nConsidered / 1000000 & 0xffffffff,(ulong)(uint)p->vForest->nSize,
               (ulong)(uint)p->nClasses,(ulong)(uint)Level);
      }
      if (p->vForest->nSize == 0x40005) {
        printf("Considered = %5d M.   Found = %8d.   Classes = %6d.   Trying %7d.\n",
               (long)p->nConsidered / 1000000 & 0xffffffff,(ulong)(uint)p->vForest->nSize,
               (ulong)(uint)p->nClasses,(ulong)(uint)Level);
        goto LAB_0055c095;
      }
    }
    Level = Level + 1;
  } while( true );
}

Assistant:

void Rwr_ManPrecompute( Rwr_Man_t * p )
{
    Rwr_Node_t * p0, * p1;
    int i, k, Level, Volume;
    int LevelOld = -1;
    int nNodes;

    Vec_PtrForEachEntryStart( Rwr_Node_t *, p->vForest, p0, i, 1 )
    Vec_PtrForEachEntryStart( Rwr_Node_t *, p->vForest, p1, k, 1 )
    {
        if ( LevelOld < (int)p0->Level )
        {
            LevelOld = p0->Level;
            printf( "Starting level %d  (at %d nodes).\n", LevelOld+1, i );
            printf( "Considered = %5d M.   Found = %8d.   Classes = %6d.   Trying %7d.\n", 
                p->nConsidered/1000000, p->vForest->nSize, p->nClasses, i );
        }

        if ( k == i )
            break;
//        if ( p0->Level + p1->Level > 6 ) // hard
//            break;

        if ( p0->Level + p1->Level > 5 ) // easy 
            break;

//        if ( p0->Level + p1->Level > 6 || (p0->Level == 3 && p1->Level == 3) )
//            break;

        // compute the level and volume of the new nodes
        Level  = 1 + Abc_MaxInt( p0->Level, p1->Level );
        Volume = 1 + Rwr_ManNodeVolume( p, p0, p1 );
        // try four different AND nodes
        Rwr_ManTryNode( p,         p0 ,         p1 , 0, Level, Volume );
        Rwr_ManTryNode( p, Rwr_Not(p0),         p1 , 0, Level, Volume );
        Rwr_ManTryNode( p,         p0 , Rwr_Not(p1), 0, Level, Volume );
        Rwr_ManTryNode( p, Rwr_Not(p0), Rwr_Not(p1), 0, Level, Volume );
        // try EXOR
        Rwr_ManTryNode( p,         p0 ,         p1 , 1, Level, Volume + 1 );
        // report the progress
        if ( p->nConsidered % 50000000 == 0 )
            printf( "Considered = %5d M.   Found = %8d.   Classes = %6d.   Trying %7d.\n", 
                p->nConsidered/1000000, p->vForest->nSize, p->nClasses, i );
        // quit after some time
        if ( p->vForest->nSize == RWR_LIMIT + 5 )
        {
            printf( "Considered = %5d M.   Found = %8d.   Classes = %6d.   Trying %7d.\n", 
                p->nConsidered/1000000, p->vForest->nSize, p->nClasses, i );
            goto save;
        }
    }
save :

    // mark the relevant ones
    Rwr_ManIncTravId( p );
    k = 5;
    nNodes = 0;
    Vec_PtrForEachEntryStart( Rwr_Node_t *, p->vForest, p0, i, 5 )
        if ( p0->uTruth == p->puCanons[p0->uTruth] )
        {
            Rwr_MarkUsed_rec( p, p0 );
            nNodes++;
        }

    // compact the array by throwing away non-canonical
    k = 5;
    Vec_PtrForEachEntryStart( Rwr_Node_t *, p->vForest, p0, i, 5 )
        if ( p0->fUsed )
        {
            p->vForest->pArray[k] = p0;
            p0->Id = k++;
        }
    p->vForest->nSize = k;
    printf( "Total canonical = %4d. Total used = %5d.\n", nNodes, p->vForest->nSize );
}